

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O1

void __thiscall
deqp::gls::VarSpec::VarSpec<tcu::Matrix<float,3,3>>
          (VarSpec *this,string *name_,Matrix<float,_3,_3> *minValue_,Matrix<float,_3,_3> *maxValue_
          )

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  set<3,3>(this,minValue_,maxValue_);
  return;
}

Assistant:

VarSpec (const std::string& name_, const T& minValue_, const T& maxValue_)	: name(name_) { set(minValue_, maxValue_); }